

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

int __thiscall H264StreamReader::processSliceNal(H264StreamReader *this,uint8_t *buff)

{
  int *piVar1;
  int64_t *piVar2;
  uint8_t *sliceEnd;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint local_ac;
  SliceUnit slice;
  
  SliceUnit::SliceUnit(&slice);
  sliceEnd = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  iVar4 = deserializeSliceHeader(this,&slice,buff,sliceEnd);
  if (iVar4 == 1) {
    iVar4 = 1;
    if ((this->m_isFirstFrame != true) || (bVar3 = findPPSForward(this,buff + 1), !bVar3))
    goto LAB_0019b9d4;
    iVar4 = deserializeSliceHeader(this,&slice,buff,sliceEnd);
  }
  if (((iVar4 != 0) || (iVar4 = 0, slice.first_mb_in_slice != 0)) ||
     (this->m_fieldFirst != slice.bottom_field_flag)) goto LAB_0019b9d4;
  iVar4 = detectPrimaryPicType(this,&slice,buff);
  if (iVar4 != 0) {
LAB_0019b690:
    iVar4 = -10;
    goto LAB_0019b9d4;
  }
  if ((((slice.sps)->frame_mbs_only_flag != 0) && (this->m_forceLsbDiv != 0)) &&
     ((slice.pic_order_cnt_lsb & 1) != 0)) {
    if ((this->super_MPEGStreamReader).m_totalFrameNum < 0xfa) {
      this->m_forceLsbDiv = 0;
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "H264 warn: Force frame_mbs_only_flag division invalid detected. Cancel this flag."
                              );
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "H264 warn: Unexpected pic_order_cnt_lsb value ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,slice.pic_order_cnt_lsb);
      poVar7 = std::operator<<(poVar7,". FrameNum: ");
      poVar7 = (ostream *)
               std::ostream::operator<<(poVar7,(this->super_MPEGStreamReader).m_totalFrameNum);
      poVar7 = std::operator<<(poVar7," slice type: ");
      poVar7 = std::operator<<(poVar7,_ZL12sliceTypeStr_rel +
                                      *(int *)(_ZL12sliceTypeStr_rel + (ulong)slice.slice_type * 4))
      ;
    }
    std::endl<char,std::char_traits<char>>(poVar7);
    sLastMsg = true;
  }
  if ((slice.sps)->pic_order_cnt_type == 2) {
    this->m_frameDepth = 0;
    iVar4 = 0;
  }
  else {
    iVar4 = calcPicOrder(this,&slice);
  }
  bVar3 = SliceUnit::isIDR(&slice);
  if (bVar3) {
    this->m_frameNum = 0;
    if ((slice.sps)->pic_order_cnt_type == 2) {
      this->m_iFramePtsOffset = 0;
    }
    else {
      iVar5 = getIdrPrevFrames(this,buff,
                               (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
      this->m_iFramePtsOffset = iVar5;
      if (iVar5 == -1) goto LAB_0019b690;
    }
  }
  else {
    iVar5 = this->m_frameNum + 1;
    this->m_frameNum = iVar5;
    if ((slice.sps)->pic_order_cnt_type == 2) {
      iVar4 = iVar5;
    }
  }
  uVar10 = iVar4 + this->m_iFramePtsOffset;
  this->m_isFirstFrame = false;
  piVar1 = &(this->super_MPEGStreamReader).m_totalFrameNum;
  *piVar1 = *piVar1 + 1;
  local_ac = uVar10;
  bVar3 = SliceUnit::isIDR(&slice);
  iVar4 = *(int *)&(this->super_MPEGStreamReader).field_0xdc;
  if (bVar3) {
    iVar4 = iVar4 + 1;
    *(int *)&(this->super_MPEGStreamReader).field_0xdc = iVar4;
    this->m_picOrderOffset = 0;
  }
  if (iVar4 == 0) {
    if ((this->m_bSliceFound == false) && (slice.slice_type == 1)) {
      this->m_bSliceFound = true;
      this->m_picOrderOffset = ~uVar10 + this->m_frameNum;
    }
    else if (this->m_bSliceFound == false) {
      local_ac = this->m_frameNum;
      goto LAB_0019b884;
    }
    uVar10 = uVar10 + this->m_picOrderOffset;
    local_ac = 0;
    if (0 < (int)uVar10) {
      local_ac = uVar10;
    }
  }
LAB_0019b884:
  checkPyramid(this,this->m_frameNum,(int *)&local_ac,
               (bool)(this->super_MPEGStreamReader).field_0xda);
  lVar8 = (this->super_MPEGStreamReader).m_curDts + this->m_lastDtsInc;
  (this->super_MPEGStreamReader).m_curDts = lVar8;
  lVar9 = ((long)(int)local_ac - (long)this->m_frameNum) *
          (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  (this->super_MPEGStreamReader).m_curPts = lVar9 + lVar8;
  if ((0 < lVar9) &&
     (((this->super_MPEGStreamReader).field_0xda != '\x01' ||
      ((this->super_MPEGStreamReader).field_0xdb == '\x01')))) {
    (this->super_MPEGStreamReader).m_curPts = lVar8;
  }
  if (this->m_OffsetMetadataPtsAddr != (uint8_t *)0x0) {
    SEIUnit::updateMetadataPts(this->m_OffsetMetadataPtsAddr,lVar8 / 0xe5b0 + this->m_startPts);
    this->m_OffsetMetadataPtsAddr = (uint8_t *)0x0;
  }
  iVar4 = this->m_lastPicStruct;
  if (iVar4 - 5U < 2) {
    lVar8 = (this->super_MPEGStreamReader).m_pcrIncPerField +
            (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  }
  else if (iVar4 == 7) {
    lVar8 = (this->super_MPEGStreamReader).m_pcrIncPerFrame * 2;
  }
  else if (iVar4 == 8) {
    lVar8 = (this->super_MPEGStreamReader).m_pcrIncPerFrame * 3;
  }
  else {
    lVar8 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  }
  this->m_lastDtsInc = lVar8;
  if ((this->super_MPEGStreamReader).m_removePulldown == true) {
    MPEGStreamReader::checkPulldownSync(&this->super_MPEGStreamReader);
    piVar2 = &(this->super_MPEGStreamReader).m_testPulldownDts;
    *piVar2 = *piVar2 + this->m_lastDtsInc;
    this->m_lastDtsInc = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  }
  this->m_lastSlicePPS = slice.pic_parameter_set_id;
  if (slice.pps == (PPSUnit *)0x0) {
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = (slice.pps)->seq_parameter_set_id;
  }
  this->m_lastSliceSPS = uVar6;
  bVar3 = SliceUnit::isIDR(&slice);
  this->m_lastSliceIDR = bVar3;
  bVar3 = SliceUnit::isIFrame(&slice);
  this->m_lastIFrame = bVar3;
  iVar4 = 0;
LAB_0019b9d4:
  NALUnit::~NALUnit(&slice.super_NALUnit);
  return iVar4;
}

Assistant:

int H264StreamReader::processSliceNal(uint8_t *buff)
{
    SliceUnit slice;
    const uint8_t *sliceEnd = m_bufEnd;

    int nalRez = deserializeSliceHeader(slice, buff, sliceEnd);

    if (nalRez == NALUnit::SPS_OR_PPS_NOT_READY && m_isFirstFrame)
    {
        if (findPPSForward(buff + 1))
            nalRez = deserializeSliceHeader(slice, buff, sliceEnd);
    }

    if (nalRez != 0)
    {
        return nalRez;
    }

    if (slice.first_mb_in_slice != 0)
        return 0;

    if (m_fieldFirst != slice.bottom_field_flag)  // insrease PTS/DTS only for whole frame
        return 0;

    if (detectPrimaryPicType(slice, buff) != 0)
        return NOT_ENOUGH_BUFFER;

    // forceLsbDiv check
    if (slice.getSPS()->frame_mbs_only_flag && m_forceLsbDiv != 0)
    {
        if (slice.pic_order_cnt_lsb % 2 == 1)
        {
            if (m_totalFrameNum < 250)
            {
                m_forceLsbDiv = 0;
                LTRACE(LT_WARN, 2, "H264 warn: Force frame_mbs_only_flag division invalid detected. Cancel this flag.");
            }
            else
            {
                LTRACE(LT_WARN, 2,
                       "H264 warn: Unexpected pic_order_cnt_lsb value "
                           << slice.pic_order_cnt_lsb << ". FrameNum: " << m_totalFrameNum
                           << " slice type: " << sliceTypeStr[slice.slice_type]);
            }
        }
    }

    ////////////////////////////

    int fullPicOrder = 0;
    if (slice.getSPS()->pic_order_cnt_type != 2)
        fullPicOrder = calcPicOrder(slice);
    else
        m_frameDepth = 0;

    if (slice.isIDR())
    {
        // LTRACE(LT_INFO, 2, "got idr slice");
        m_frameNum = 0;
        if (slice.getSPS()->pic_order_cnt_type != 2)
            m_iFramePtsOffset = getIdrPrevFrames(buff, m_bufEnd);
        else
            m_iFramePtsOffset = 0;
        if (m_iFramePtsOffset == -1)
            return NOT_ENOUGH_BUFFER;
    }
    else
    {
        m_frameNum++;
        // m_frameNum = slice.frame_num;

        if (slice.getSPS()->pic_order_cnt_type == 2)
            fullPicOrder = m_frameNum;
    }
    fullPicOrder += m_iFramePtsOffset;

    m_isFirstFrame = false;
    m_totalFrameNum++;

    if (slice.isIDR())
    {
        m_idrSliceCnt++;
        m_picOrderOffset = 0;
    }
    if (m_idrSliceCnt == 0)
    {
        if (!m_bSliceFound && slice.slice_type == SliceUnit::B_TYPE)
        {
            m_bSliceFound = true;
            m_picOrderOffset = m_frameNum - fullPicOrder - 1;
        }
        if (m_bSliceFound)
        {
            fullPicOrder += m_picOrderOffset;
            if (fullPicOrder < 0)
                fullPicOrder = 0;
        }
        else
            fullPicOrder = m_frameNum;
    }

    // check b-pyramid
    checkPyramid(m_frameNum, &fullPicOrder, m_nextFrameFound);

    // increase PTS/DTS
    m_curDts += m_lastDtsInc;
    m_curPts = m_curDts + (fullPicOrder - m_frameNum) * m_pcrIncPerFrame;

    if (m_curPts > m_curDts && (!m_nextFrameFound || m_nextFrameIdr))
        m_curPts = m_curDts;

    if (m_OffsetMetadataPtsAddr)
    {
        const auto pts90k = m_curDts / INT_FREQ_TO_TS_FREQ + m_startPts;
        SEIUnit::updateMetadataPts(m_OffsetMetadataPtsAddr, pts90k);
        m_OffsetMetadataPtsAddr = nullptr;
    }
    // LTRACE(LT_INFO, 2, "delta=" << fullPicOrder - m_frameNum << " m_lastDtsInc=" << m_lastDtsInc);

    if (m_lastPicStruct == 5 || m_lastPicStruct == 6)  // 3 fields per frame. Used in pulldown
        m_lastDtsInc = m_pcrIncPerFrame + m_pcrIncPerField;
    else if (m_lastPicStruct == 7)  // frame doubling. Used in pulldown
        m_lastDtsInc = m_pcrIncPerFrame * 2;
    else if (m_lastPicStruct == 8)  // frame tripling. Used in pulldown
        m_lastDtsInc = m_pcrIncPerFrame * 3;
    else
        m_lastDtsInc = m_pcrIncPerFrame;

    if (m_removePulldown)
    {
        checkPulldownSync();
        m_testPulldownDts += m_lastDtsInc;
        m_lastDtsInc = m_pcrIncPerFrame;
    }

    m_lastSlicePPS = slice.pic_parameter_set_id;
    if (slice.getPPS() != nullptr)
        m_lastSliceSPS = slice.getPPS()->seq_parameter_set_id;
    else
        m_lastSliceSPS = -1;
    m_lastSliceIDR = slice.isIDR();
    m_lastIFrame = slice.isIFrame();

    return 0;
}